

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<int>::emplace_back<int_const&>(SmallVectorBase<int> *this,int *args)

{
  iterator piVar1;
  int *in_RSI;
  SmallVectorBase<int> *in_RDI;
  int *in_stack_00000020;
  pointer in_stack_00000028;
  SmallVectorBase<int> *in_stack_00000030;
  pointer local_8;
  
  if (in_RDI->len == in_RDI->cap) {
    end(in_RDI);
    local_8 = emplaceRealloc<int_const&>(in_stack_00000030,in_stack_00000028,in_stack_00000020);
  }
  else {
    piVar1 = end(in_RDI);
    *piVar1 = *in_RSI;
    in_RDI->len = in_RDI->len + 1;
    local_8 = back(in_RDI);
  }
  return local_8;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }